

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  iterator *piVar2;
  iterator *piVar3;
  iterator *piVar4;
  iterator *piVar5;
  iterator *piVar6;
  bool bVar7;
  iterator *piVar8;
  ulong uVar9;
  ulong *in_RSI;
  iterator iVar10;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
    ::iterator::operator*((iterator *)this);
LAB_001eed5f:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == kEmptyGroup + 0x10) goto LAB_001eed5f;
    if (kSentinel < *pcVar1) {
      return (this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
  ::iterator::operator*((iterator *)this);
  piVar2 = (iterator *)this->ctrl_;
  if ((piVar2 == (iterator *)(kEmptyGroup + 0x10) || piVar2 == (iterator *)0x0) ||
     (-1 < *(char *)&piVar2->ctrl_)) {
    piVar3 = (iterator *)*in_RSI;
    if ((piVar3 != (iterator *)(kEmptyGroup + 0x10) && piVar3 != (iterator *)0x0) &&
       (*(char *)&piVar3->ctrl_ < '\0')) goto LAB_001eee58;
    if (piVar2 == (iterator *)(kEmptyGroup + 0x10) && piVar3 == (iterator *)(kEmptyGroup + 0x10)) {
LAB_001eee4b:
      return (reference)CONCAT71((int7)((ulong)piVar2 >> 8),piVar2 == piVar3);
    }
    if ((piVar2 == (iterator *)(kEmptyGroup + 0x10)) == (piVar3 == (iterator *)(kEmptyGroup + 0x10))
       ) {
      if (piVar2 == (iterator *)0x0 || piVar3 == (iterator *)0x0) goto LAB_001eee4b;
      if ((piVar3 == (iterator *)kSooControl) == (piVar2 == (iterator *)kSooControl)) {
        this = (iterator *)(this->field_1).slot_;
        piVar4 = (iterator *)in_RSI[1];
        if (piVar2 == (iterator *)kSooControl) {
          bVar7 = this == piVar4;
        }
        else {
          piVar8 = piVar4;
          piVar5 = piVar3;
          piVar6 = this;
          if (piVar3 < piVar2) {
            piVar8 = this;
            piVar5 = piVar2;
            piVar6 = piVar4;
          }
          in_RSI = (ulong *)CONCAT71((int7)((ulong)piVar5 >> 8),piVar5 < piVar6);
          bVar7 = piVar6 <= piVar8 && piVar5 < piVar6;
        }
        if (bVar7) goto LAB_001eee4b;
      }
      goto LAB_001eee62;
    }
  }
  else {
    container_internal::operator==();
LAB_001eee58:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_001eee62:
  container_internal::operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              *)this);
  if (this->ctrl_ == (ctrl_t *)0x1) {
    iVar10 = find_soo<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                            *)this,(key_arg<int> *)in_RSI);
    return (reference)iVar10.ctrl_;
  }
  if (this->ctrl_ == (ctrl_t *)0x0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              *)this);
  uVar9 = ((ulong)(uint)*in_RSI ^ (ulong)&hash_internal::MixingHashState::kSeed) *
          -0x234dd359734ecb13;
  iVar10 = find_non_soo<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                              *)this,(key_arg<int> *)in_RSI,
                             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                             (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                             (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
  return (reference)iVar10.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }